

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPInform.cpp
# Opt level: O2

void remove_inform_from_list
               (list<InformItem_*,_std::allocator<InformItem_*>_> *list,
               function<bool_(InformItem_*)> *predicate)

{
  _List_node_base *p_Var1;
  InformItem *__args;
  bool bVar2;
  _List_node_base *p_Var3;
  __off64_t *in_R8;
  size_t in_R9;
  list<InformItem_*,_std::allocator<InformItem_*>_> __to_destroy;
  _List_node_base *p_Var4;
  
  p_Var4 = (_List_node_base *)&stack0xffffffffffffffb8;
  p_Var1 = (list->super__List_base<InformItem_*,_std::allocator<InformItem_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var3 = p_Var1, p_Var3 != (_List_node_base *)list) {
    p_Var1 = (((_List_base<InformItem_*,_std::allocator<InformItem_*>_> *)&p_Var3->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    __args = (InformItem *)p_Var3[1]._M_next;
    bVar2 = std::function<bool_(InformItem_*)>::operator()(predicate,__args);
    if (bVar2) {
      free(__args);
      std::__cxx11::list<InformItem_*,_std::allocator<InformItem_*>_>::splice
                ((list<InformItem_*,_std::allocator<InformItem_*>_> *)&stack0xffffffffffffffb8,
                 (int)p_Var4,(__off64_t *)list,(int)p_Var3,in_R8,in_R9,(int)p_Var4);
    }
  }
  std::__cxx11::_List_base<InformItem_*,_std::allocator<InformItem_*>_>::_M_clear
            ((_List_base<InformItem_*,_std::allocator<InformItem_*>_> *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

static void remove_inform_from_list(std::list<struct InformItem *> &list,
                             std::function<bool(struct InformItem *)> predicate) {
    list.remove_if([&predicate](struct InformItem* item){
        if(predicate(item)){
            delete_inform(item);
            return true;
        }
        return false;
    });
}